

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::FieldOptions::ByteSizeLong(FieldOptions *this)

{
  RepeatedField<int> *this_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  Rep *pRVar7;
  ulong uVar8;
  long lVar9;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_01;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *this_02;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *pRVar10;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *pRVar11;
  
  sVar5 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  this_00 = &(this->field_0)._impl_.targets_;
  sVar6 = internal::WireFormatLite::EnumSize(this_00);
  uVar3 = internal::SooRep::size
                    (&this_00->soo_rep_,(*(byte *)((long)&this->field_0 + 0x20) & 4) == 0);
  iVar1 = *(int *)((long)&this->field_0 + 0x38);
  this_02 = &(this->field_0)._impl_.edition_defaults_;
  pRVar10 = this_02;
  if ((*(byte *)((long)&this->field_0 + 0x30) & 1) != 0) {
    pRVar7 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
    pRVar10 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)pRVar7->elements;
  }
  if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar7 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
    this_02 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)pRVar7->elements;
  }
  lVar9 = sVar6 + sVar5 + ((long)iVar1 + (ulong)uVar3) * 2;
  iVar1 = *(int *)((long)&this->field_0 + 0x38);
  for (; pRVar10 !=
         (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
         (&(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar10 = (RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *)
                &(pRVar10->super_RepeatedPtrFieldBase).current_size_) {
    sVar5 = FieldOptions_EditionDefault::ByteSizeLong
                      ((FieldOptions_EditionDefault *)
                       (pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar5 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar9 = lVar9 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x50);
  this_01 = &(this->field_0)._impl_.uninterpreted_option_;
  pRVar11 = this_01;
  if ((*(byte *)((long)&this->field_0 + 0x48) & 1) != 0) {
    pRVar7 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
    pRVar11 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)pRVar7->elements;
  }
  if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar7 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
    this_01 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)pRVar7->elements;
  }
  sVar5 = (long)iVar1 * 2 + lVar9;
  iVar1 = *(int *)((long)&this->field_0 + 0x50);
  for (; pRVar11 !=
         (RepeatedPtrField<google::protobuf::UninterpretedOption> *)
         (&(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar11 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)
                &(pRVar11->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = UninterpretedOption::ByteSizeLong
                      ((UninterpretedOption *)
                       (pRVar11->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar6 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  uVar3 = *(uint *)((long)&this->field_0 + 0x18);
  if ((char)uVar3 != '\0') {
    if ((uVar3 & 1) != 0) {
      sVar6 = FeatureSet::ByteSizeLong((this->field_0)._impl_.features_);
      uVar4 = (uint)sVar6 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 2) != 0) {
      sVar6 = FieldOptions_FeatureSupport::ByteSizeLong((this->field_0)._impl_.feature_support_);
      uVar4 = (uint)sVar6 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 4) != 0) {
      uVar8 = (long)(this->field_0)._impl_.ctype_ | 1;
      lVar9 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar9 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 8) != 0) {
      uVar8 = (long)(this->field_0)._impl_.jstype_ | 1;
      lVar9 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar9 * 9 + 0x49U >> 6) + 1;
    }
    sVar5 = sVar5 + ((uVar3 >> 6 & 2) + (uVar3 >> 5 & 2) + (uVar3 >> 4 & 2) + (uVar3 >> 3 & 2));
  }
  if ((uVar3 & 0x700) != 0) {
    sVar6 = sVar5 + 3;
    if ((uVar3 >> 9 & 1) == 0) {
      sVar6 = sVar5;
    }
    sVar5 = sVar6 + (uVar3 >> 7 & 2);
    if ((uVar3 >> 10 & 1) != 0) {
      uVar8 = (long)(this->field_0)._impl_.retention_ | 1;
      lVar9 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar9 * 9 + 0x49U >> 6) + 2;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t FieldOptions::ByteSizeLong() const {
          const FieldOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldOptions)
          ::size_t total_size = 0;
          total_size += this_._impl_._extensions_.ByteSize();

          ::uint32_t cached_has_bits = 0;
          // Prevent compiler warnings about cached_has_bits being unused
          (void)cached_has_bits;

          ::_pbi::Prefetch5LinesFrom7Lines(&this_);
           {
            // repeated .google.protobuf.FieldOptions.OptionTargetType targets = 19;
            {
              std::size_t data_size =
                  ::_pbi::WireFormatLite::EnumSize(this_._internal_targets());
              std::size_t tag_size = std::size_t{2} *
                  ::_pbi::FromIntSize(this_._internal_targets_size());
              total_size += data_size + tag_size;
            }
            // repeated .google.protobuf.FieldOptions.EditionDefault edition_defaults = 20;
            {
              total_size += 2UL * this_._internal_edition_defaults_size();
              for (const auto& msg : this_._internal_edition_defaults()) {
                total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
              }
            }
            // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
            {
              total_size += 2UL * this_._internal_uninterpreted_option_size();
              for (const auto& msg : this_._internal_uninterpreted_option()) {
                total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
              }
            }
          }
          cached_has_bits = this_._impl_._has_bits_[0];
          if (cached_has_bits & 0x000000ffu) {
            // optional .google.protobuf.FeatureSet features = 21;
            if (cached_has_bits & 0x00000001u) {
              total_size += 2 +
                            ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
            }
            // optional .google.protobuf.FieldOptions.FeatureSupport feature_support = 22;
            if (cached_has_bits & 0x00000002u) {
              total_size += 2 +
                            ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.feature_support_);
            }
            // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
            if (cached_has_bits & 0x00000004u) {
              total_size += 1 +
                            ::_pbi::WireFormatLite::EnumSize(this_._internal_ctype());
            }
            // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
            if (cached_has_bits & 0x00000008u) {
              total_size += 1 +
                            ::_pbi::WireFormatLite::EnumSize(this_._internal_jstype());
            }
            // optional bool packed = 2;
            if (cached_has_bits & 0x00000010u) {
              total_size += 2;
            }
            // optional bool lazy = 5 [default = false];
            if (cached_has_bits & 0x00000020u) {
              total_size += 2;
            }
            // optional bool unverified_lazy = 15 [default = false];
            if (cached_has_bits & 0x00000040u) {
              total_size += 2;
            }
            // optional bool deprecated = 3 [default = false];
            if (cached_has_bits & 0x00000080u) {
              total_size += 2;
            }
          }
          if (cached_has_bits & 0x00000700u) {
            // optional bool weak = 10 [default = false];
            if (cached_has_bits & 0x00000100u) {
              total_size += 2;
            }
            // optional bool debug_redact = 16 [default = false];
            if (cached_has_bits & 0x00000200u) {
              total_size += 3;
            }
            // optional .google.protobuf.FieldOptions.OptionRetention retention = 17;
            if (cached_has_bits & 0x00000400u) {
              total_size += 2 +
                            ::_pbi::WireFormatLite::EnumSize(this_._internal_retention());
            }
          }
          return this_.MaybeComputeUnknownFieldsSize(total_size,
                                                     &this_._impl_._cached_size_);
        }